

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O1

var __thiscall
cs::make_cni<cs::numeric(&)(std::__cxx11::string_const&)>
          (cs *this,
          _func_numeric_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *func,
          types type)

{
  cni local_20;
  types local_14;
  
  local_14 = type;
  local_20.mCni =
       cs_impl::cni::construct_helper<cs::numeric(*)(std::__cxx11::string_const&)>::
       _construct<cs::numeric(&)(std::__cxx11::string_const&),cs::numeric,std::__cxx11::string_const&>
                 (func,(_func_numeric_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                        *)0x0);
  cs_impl::any::make_protect<cs::callable,cs_impl::cni,cs::callable::types&>
            ((any *)this,&local_20,&local_14);
  if (local_20.mCni != (cni_holder_base *)0x0) {
    (*(local_20.mCni)->_vptr_cni_holder_base[1])();
  }
  return (var)(proxy *)this;
}

Assistant:

var make_cni(T &&func, callable::types type)
	{
		return var::make_protect<callable>(cni(func), type);
	}